

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ecp.c
# Opt level: O3

int mbedtls_ecp_tls_write_point
              (mbedtls_ecp_group *grp,mbedtls_ecp_point *pt,int format,size_t *olen,uchar *buf,
              size_t blen)

{
  int iVar1;
  
  if (blen != 0) {
    iVar1 = mbedtls_ecp_point_write_binary(grp,pt,format,olen,buf + 1,blen - 1);
    if (iVar1 == 0) {
      *buf = (uchar)*olen;
      *olen = *olen + 1;
      iVar1 = 0;
    }
    return iVar1;
  }
  return -0x4f80;
}

Assistant:

int mbedtls_ecp_tls_write_point( const mbedtls_ecp_group *grp, const mbedtls_ecp_point *pt,
                         int format, size_t *olen,
                         unsigned char *buf, size_t blen )
{
    int ret;

    /*
     * buffer length must be at least one, for our length byte
     */
    if( blen < 1 )
        return( MBEDTLS_ERR_ECP_BAD_INPUT_DATA );

    if( ( ret = mbedtls_ecp_point_write_binary( grp, pt, format,
                    olen, buf + 1, blen - 1) ) != 0 )
        return( ret );

    /*
     * write length to the first byte and update total length
     */
    buf[0] = (unsigned char) *olen;
    ++*olen;

    return( 0 );
}